

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall
LLVMBC::ModuleParseContext::parse_paramattr_group_block
          (ModuleParseContext *this,BlockOrRecord *entry)

{
  ulong uVar1;
  pointer pBVar2;
  pointer puVar3;
  bool bVar4;
  LoggingCallback p_Var5;
  void *pvVar6;
  vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>,dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>>>
  *this_00;
  unsigned_long uVar7;
  unsigned_long uVar8;
  ulong uVar9;
  ulong uVar10;
  char cVar11;
  ulong uVar12;
  BlockOrRecord *child;
  pointer pBVar13;
  bool bVar14;
  String value;
  uint64_t group_id;
  char buffer [4096];
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_1060;
  unsigned_long local_1040;
  undefined1 local_1038 [4104];
  
  if ((this->attribute_groups)._M_h._M_element_count == 0) {
    pBVar13 = (entry->children).
              super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (entry->children).
             super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar14 = pBVar13 == pBVar2;
    if (!bVar14) {
      do {
        cVar11 = '\a';
        if ((pBVar13->blockDwordLength == 0) && (pBVar13->id == 3)) {
          puVar3 = (pBVar13->ops).
                   super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          cVar11 = '\x01';
          if (0x10 < (ulong)((long)(pBVar13->ops).
                                   super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
            local_1040 = *puVar3;
            cVar11 = '\a';
            if (puVar3[1] == 0xffffffff) {
              this_00 = (vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>,dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>>>
                         *)std::__detail::
                           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)&this->attribute_groups,&local_1040);
              uVar12 = (long)(pBVar13->ops).
                             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pBVar13->ops).
                             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3;
              uVar9 = 2;
              if (2 < uVar12) {
                uVar9 = 2;
                do {
                  puVar3 = (pBVar13->ops).
                           super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  uVar8 = puVar3[uVar9];
                  cVar11 = '\x01';
                  switch(uVar8) {
                  case 0:
                    uVar10 = uVar9 + 2;
                    break;
                  case 1:
                    if (uVar12 <= uVar9 + 1) goto switchD_001867bf_caseD_2;
                    uVar10 = uVar9 + 2;
                    if (((ulong)(uint)puVar3[uVar9 + 1] < 0x34) &&
                       ((0x8060002000002U >> ((ulong)(uint)puVar3[uVar9 + 1] & 0x3f) & 1) != 0)) {
                      uVar10 = uVar9 + 3;
                    }
                    break;
                  default:
                    goto switchD_001867bf_caseD_2;
                  case 3:
                  case 4:
                    local_1038._0_8_ = local_1038 + 0x10;
                    local_1038._8_8_ = 0;
                    local_1038._16_8_ = local_1038._16_8_ & 0xffffffffffffff00;
                    local_1060._M_dataplus._M_p = (pointer)&local_1060.field_2;
                    local_1060._M_string_length = 0;
                    local_1060.field_2._M_local_buf[0] = '\0';
                    uVar10 = uVar9 + 1;
                    uVar7 = (pBVar13->ops).
                            super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar9 + 1];
                    if ((uVar10 < uVar12) && (uVar7 != 0)) {
                      do {
                        uVar10 = uVar9;
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                        ::push_back((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                     *)local_1038,(char)uVar7);
                        uVar7 = (pBVar13->ops).
                                super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10 + 2];
                        uVar9 = uVar10 + 1;
                        if (uVar12 <= uVar10 + 2) break;
                      } while (uVar7 != 0);
                      uVar10 = uVar10 + 2;
                    }
                    if (uVar7 == 0) {
                      uVar10 = uVar9 + 2;
                      if (uVar8 == 4) {
                        uVar8 = (pBVar13->ops).
                                super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar9 + 2];
                        if ((uVar10 < uVar12) && (uVar8 != 0)) {
                          uVar9 = uVar9 + 3;
                          do {
                            uVar10 = uVar9;
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                            ::push_back(&local_1060,(char)uVar8);
                            uVar8 = (pBVar13->ops).
                                    super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar10];
                            if (uVar12 <= uVar10) break;
                            uVar9 = uVar10 + 1;
                          } while (uVar8 != 0);
                        }
                        if (uVar8 != 0) goto LAB_00186833;
                        uVar10 = uVar10 + 1;
                      }
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>,dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>>>
                      ::
                      emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>
                                (this_00,(basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                          *)local_1038,&local_1060);
                      bVar4 = true;
                    }
                    else {
LAB_00186833:
                      bVar4 = false;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
                         *)local_1060._M_dataplus._M_p != &local_1060.field_2) {
                      ::dxil_spv::free_in_thread(local_1060._M_dataplus._M_p);
                    }
                    if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) {
                      ::dxil_spv::free_in_thread((void *)local_1038._0_8_);
                    }
                    if (!bVar4) goto switchD_001867bf_caseD_2;
                    break;
                  case 5:
                  case 6:
                    uVar1 = uVar9 + 1;
                    uVar10 = uVar1;
                    if (((uVar1 < uVar12) && (uVar10 = uVar9 + 2, (int)puVar3[uVar9 + 1] == 3)) &&
                       (uVar8 == 6)) {
                      uVar10 = uVar9 + 3;
                    }
                    if (uVar12 <= uVar1) goto switchD_001867bf_caseD_2;
                  }
                  uVar9 = uVar10;
                } while (uVar9 < uVar12);
              }
              cVar11 = uVar12 < uVar9;
            }
switchD_001867bf_caseD_2:
          }
        }
        if ((cVar11 != '\a') && (cVar11 != '\0')) {
          return bVar14;
        }
        pBVar13 = pBVar13 + 1;
        bVar14 = pBVar13 == pBVar2;
      } while (!bVar14);
    }
  }
  else {
    p_Var5 = ::dxil_spv::get_thread_log_callback();
    if (p_Var5 == (LoggingCallback)0x0) {
      parse_paramattr_group_block();
    }
    else {
      local_1038[0x10] = 'p';
      local_1038[0x11] = 'l';
      local_1038[0x12] = 'e';
      local_1038[0x13] = ' ';
      local_1038[0x14] = 'g';
      local_1038[0x15] = 'r';
      local_1038[0x16] = 'o';
      local_1038[0x17] = 'u';
      local_1038._24_7_ = 0x6b636f6c622070;
      local_1038[0] = 'C';
      local_1038[1] = 'a';
      local_1038[2] = 'n';
      local_1038[3] = 'n';
      local_1038[4] = 'o';
      local_1038[5] = 't';
      local_1038[6] = ' ';
      local_1038[7] = 'u';
      local_1038[8] = 's';
      local_1038[9] = 'e';
      local_1038[10] = ' ';
      local_1038[0xb] = 'm';
      local_1038[0xc] = 'u';
      local_1038[0xd] = 'l';
      local_1038[0xe] = 't';
      local_1038[0xf] = 'i';
      local_1038._31_4_ = 0xa2e73;
      pvVar6 = ::dxil_spv::get_thread_log_callback_userdata();
      (*p_Var5)(pvVar6,Error,local_1038);
    }
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

static BinaryOperator::BinaryOps translate_binop(BinOp op, Type *type)
{
	bool is_fp = type->isFloatingPointTy();
	switch (op)
	{
	case BinOp::ADD:
		return is_fp ? BinaryOperator::BinaryOps::FAdd : BinaryOperator::BinaryOps::Add;
	case BinOp::SUB:
		return is_fp ? BinaryOperator::BinaryOps::FSub : BinaryOperator::BinaryOps::Sub;
	case BinOp::MUL:
		return is_fp ? BinaryOperator::BinaryOps::FMul : BinaryOperator::BinaryOps::Mul;
	case BinOp::UDIV:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::UDiv;
	case BinOp::SDIV:
		return is_fp ? BinaryOperator::BinaryOps::FDiv : BinaryOperator::BinaryOps::SDiv;
	case BinOp::UREM:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::URem;
	case BinOp::SREM:
		return is_fp ? BinaryOperator::BinaryOps::FRem : BinaryOperator::BinaryOps::SRem;
	case BinOp::SHL:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::Shl;
	case BinOp::LSHR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::LShr;
	case BinOp::ASHR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::AShr;
	case BinOp::AND:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::And;
	case BinOp::OR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::Or;
	case BinOp::XOR:
		return is_fp ? BinaryOperator::BinaryOps::InvalidBinaryOp : BinaryOperator::BinaryOps::Xor;
	default:
		return BinaryOperator::BinaryOps::InvalidBinaryOp;
	}
}